

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

bool __thiscall QJsonPrivate::Parser::parseObject(Parser *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  QCborContainerPrivate *o;
  QCborContainerPrivate *in_RDI;
  char token;
  QCborContainerPrivate *in_stack_00000040;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  iVar3 = *(int *)&(in_RDI->data).d.ptr + 1;
  *(int *)&(in_RDI->data).d.ptr = iVar3;
  if (iVar3 < 0x401) {
    cVar1 = nextToken((Parser *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    do {
      if (cVar1 != '\"') {
LAB_00497517:
        if (cVar1 != '}') {
          *(undefined4 *)((long)&(in_RDI->data).d.ptr + 4) = 1;
          return false;
        }
        *(int *)&(in_RDI->data).d.ptr = *(int *)&(in_RDI->data).d.ptr + -1;
        bVar2 = ::QExplicitlySharedDataPointer::operator_cast_to_bool
                          ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x49754b);
        if (bVar2) {
          QExplicitlySharedDataPointer<QCborContainerPrivate>::data
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x49755f);
          sortContainer(in_stack_00000040);
        }
        return true;
      }
      bVar2 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                        ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x497487);
      if (bVar2) {
        o = (QCborContainerPrivate *)operator_new(0x40);
        QCborContainerPrivate::QCborContainerPrivate(in_RDI);
        QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
                  ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_RDI,o);
      }
      bVar2 = parseMember((Parser *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      if (!bVar2) {
        return false;
      }
      cVar1 = nextToken((Parser *)CONCAT17(cVar1,in_stack_ffffffffffffffe8));
      if (cVar1 != ',') goto LAB_00497517;
      cVar1 = nextToken((Parser *)CONCAT17(0x2c,in_stack_ffffffffffffffe8));
    } while (cVar1 != '}');
    *(undefined4 *)((long)&(in_RDI->data).d.ptr + 4) = 0xb;
  }
  else {
    *(undefined4 *)((long)&(in_RDI->data).d.ptr + 4) = 0xc;
  }
  return false;
}

Assistant:

bool Parser::parseObject()
{
    if (++nestingLevel > nestingLimit) {
        lastError = QJsonParseError::DeepNesting;
        return false;
    }

    char token = nextToken();
    while (token == Quote) {
        if (!container)
            container = new QCborContainerPrivate;
        if (!parseMember())
            return false;
        token = nextToken();
        if (token != ValueSeparator)
            break;
        token = nextToken();
        if (token == EndObject) {
            lastError = QJsonParseError::MissingObject;
            return false;
        }
    }

    if (token != EndObject) {
        lastError = QJsonParseError::UnterminatedObject;
        return false;
    }

    --nestingLevel;

    if (container)
        sortContainer(container.data());
    return true;
}